

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O2

int do_naming(obj *obj)

{
  boolean bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  void *pvVar6;
  char *planA;
  size_t sVar7;
  char *pcVar8;
  char c;
  long lVar9;
  char *last_resort;
  nh_menuitem *pnVar10;
  int iVar11;
  menulist menu;
  short local_22e;
  int selected [1];
  char buf [256];
  char title [128];
  char qbuf [128];
  
  init_menulist(&menu);
  if (obj == (obj *)0x0) {
    builtin_strncpy(title + 0x10," to name?",10);
    builtin_strncpy(title,"What do you wish",0x10);
    lVar9 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar9 * 0x218);
    }
    lVar9 = (long)menu.icount;
    menu.items[lVar9].id = 1;
    menu.items[lVar9].role = MI_NORMAL;
    menu.items[lVar9].accel = 'C';
    menu.items[lVar9].group_accel = '\0';
    menu.items[lVar9].selected = '\0';
    builtin_strncpy(menu.items[lVar9].caption,"Name a m",8);
    builtin_strncpy(menu.items[lVar9].caption + 7,"monster",8);
    menu.icount = menu.icount + 1;
    if (menu.size <= menu.icount) {
      lVar9 = (long)menu.size;
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar9 * 0x218);
    }
    menu.items[menu.icount].id = 2;
    menu.items[menu.icount].role = MI_NORMAL;
    menu.items[menu.icount].accel = 'y';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"Name an individu",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x10,"al item",8);
    menu.icount = menu.icount + 1;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,(long)menu.size * 0x10c);
    }
    menu.items[menu.icount].id = 3;
    menu.items[menu.icount].role = MI_NORMAL;
    menu.items[menu.icount].accel = 'n';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"Name all items o",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x10,"f a certain type",0x10);
    menu.items[menu.icount].caption[0x20] = '\0';
    menu.icount = menu.icount + 1;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,(long)menu.size * 0x10c);
    }
    menu.items[menu.icount].id = 4;
    menu.items[menu.icount].role = MI_NORMAL;
    menu.items[menu.icount].accel = 'f';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"Annotate this le",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x10,"vel",4);
    iVar11 = menu.icount + 1;
    pnVar10 = menu.items;
    menu.icount = iVar11;
LAB_00179f21:
    iVar11 = display_menu(pnVar10,iVar11,title,1,selected);
    free(menu.items);
    if (iVar11 == 0) {
      return 0;
    }
  }
  else {
    pcVar5 = simple_typename((int)obj->otyp);
    if ((obj->quan < 2) && (obj->oartifact != '\x1d')) {
      pcVar8 = "";
    }
    else {
      pcVar5 = makeplural(pcVar5);
      pcVar8 = "stack of ";
    }
    snprintf(title,0x80,"Name this individual %s%s?",pcVar8,pcVar5);
    lVar9 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar9 * 0x218);
    }
    pnVar10 = menu.items + menu.icount;
    pnVar10->id = 2;
    pnVar10->role = MI_NORMAL;
    pnVar10->accel = 'y';
    pnVar10->group_accel = '\0';
    pnVar10->selected = '\0';
    if (obj->quan < 2) {
      pcVar5 = "Yes, just this item";
      if (obj->oartifact == '\x1d') {
        pcVar5 = "Yes, just this stack";
      }
    }
    else {
      pcVar5 = "Yes, just this stack";
    }
    strcpy(pnVar10->caption,pcVar5);
    menu.icount = menu.icount + 1;
    lVar9 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar9 * 0x218);
    }
    pnVar10 = menu.items;
    menu.items[menu.icount].id = 3;
    menu.items[menu.icount].role = MI_NORMAL;
    menu.items[menu.icount].accel = 'n';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"No, call all ite",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x10,"ms of this type",0x10);
    iVar11 = menu.icount + 1;
    menu.icount = iVar11;
    pvVar6 = memchr("\t\b\v\x04\x05\r\n\x03\x06",(int)obj->oclass,10);
    if (pvVar6 != (void *)0x0) goto LAB_00179f21;
    selected[0] = 2;
    free(pnVar10);
  }
  switch(selected[0]) {
  case 1:
    do_mname();
    break;
  case 2:
    if ((obj == (obj *)0x0) &&
       (obj = getobj("\x02\x03\x04\x05\x06\a\b\t\n\v\r\x0e\x0f\x10\x11","name",(obj **)0x0),
       obj == (obj *)0x0)) {
      return 0;
    }
    pcVar5 = simple_typename((int)obj->otyp);
    if (obj->quan < 2) {
      pcVar8 = "this";
      if (obj->oartifact == '\x1d') {
        pcVar8 = "these";
      }
    }
    else {
      pcVar8 = "these";
    }
    planA = xname(obj);
    if ((obj->quan < 2) && (obj->oartifact != '\x1d')) {
      last_resort = "thing";
    }
    else {
      pcVar5 = makeplural(pcVar5);
      if (obj->quan < 2) {
        last_resort = "thing";
        if (obj->oartifact == '\x1d') {
          last_resort = "things";
        }
      }
      else {
        last_resort = "things";
      }
    }
    pcVar5 = safe_qbuf("",0x21,planA,pcVar5,last_resort);
    sprintf(qbuf,"What do you want to name %s %s?",pcVar8,pcVar5);
    getlin(qbuf,buf);
    if (buf[0] == '\0') {
      return 0;
    }
    if (buf[0] == '\x1b') {
      return 0;
    }
    mungspaces(buf);
    pcVar5 = artifact_name(buf,&local_22e);
    if ((pcVar5 != (char *)0x0) && (local_22e == obj->otyp)) {
      strcpy(buf,pcVar5);
    }
    if (obj->oartifact == '\0') {
      bVar1 = restrict_name(obj,buf,'\0');
      if ((bVar1 != '\0') || (bVar1 = exist_artifact((int)obj->otyp,buf), bVar1 != '\0')) {
        sVar7 = strlen(buf);
        uVar3 = rn2((int)sVar7);
        cVar2 = lowc(buf[uVar3]);
        do {
          uVar4 = mt_random();
          c = (char)((ulong)uVar4 % 0x19) + 'a';
        } while (cVar2 == c);
        if (buf[uVar3] != cVar2) {
          c = highc(c);
        }
        buf[uVar3] = c;
        pcVar5 = body_part(6);
        pline("While engraving your %s slips.",pcVar5);
        (*windowprocs.win_pause)(P_MESSAGE);
        pline("You engrave: \"%s\".",buf);
      }
      oname(obj,buf);
      return 0;
    }
    pcVar5 = "The artifact seems to resist the attempt.";
    goto LAB_0017a11d;
  case 3:
    if ((obj == (obj *)0x0) &&
       (obj = getobj("\t\b\v\x04\x05\r\n\x03\x06","call",(obj **)0x0), obj == (obj *)0x0)) {
      return 0;
    }
    examine_object(obj);
    if ((obj->field_0x4a & 0x20) != 0) {
      docall(obj);
      return 0;
    }
    pcVar5 = "You would never recognize another one.";
LAB_0017a11d:
    pline(pcVar5);
    break;
  case 4:
    donamelevel();
  }
  return 0;
}

Assistant:

int do_naming(struct obj *obj)
{
	int n, selected[1];
	struct menulist menu;
	char title[QBUFSZ];

	init_menulist(&menu);

	if (obj) {
	    char *otypname = simple_typename(obj->otyp);
	    snprintf(title, QBUFSZ, "Name this individual %s%s?",
		     is_plural(obj) ? "stack of " : "",
		     is_plural(obj) ? makeplural(otypname) : otypname);
	    add_menuitem(&menu, 2, is_plural(obj) ? "Yes, just this stack" :
						    "Yes, just this item",
			 'y', FALSE);
	    add_menuitem(&menu, 3, "No, call all items of this type", 'n', FALSE);
	} else {
	    snprintf(title, QBUFSZ, "What do you wish to name?");
	    add_menuitem(&menu, 1, "Name a monster", 'C', FALSE);
	    add_menuitem(&menu, 2, "Name an individual item", 'y', FALSE);
	    add_menuitem(&menu, 3, "Name all items of a certain type", 'n', FALSE);
	    add_menuitem(&menu, 4, "Annotate this level", 'f', FALSE);
	}

	if (!obj || strchr(callable, obj->oclass)) {
	    n = display_menu(menu.items, menu.icount, title, PICK_ONE, selected);
	} else {
	    /* simulate choice to name individual item automatically */
	    n = 1;
	    selected[0] = 2;	/* name one */
	}

	free(menu.items);
	if (n)
	    n = selected[0] - 1;
	else
	    return 0;

	switch (n) {
	    default: break;
	    case 0:
		do_mname();
		break;
	    case 1:
		do_oname(obj);
		break;
	    case 2:
		do_tname(obj);
		break;
	    case 3:
		donamelevel();
		break;
	}
	return 0;
}